

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_greedy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *ilimit_w;
  ZSTD_compressionParameters *cParams_00;
  ulong *iEnd;
  BYTE *iStart;
  ulong *puVar4;
  undefined8 *puVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  BYTE *pBVar9;
  BYTE *pBVar10;
  U32 *pUVar11;
  seqDef *psVar12;
  undefined8 uVar13;
  bool bVar14;
  uint uVar15;
  size_t sVar16;
  BYTE *pBVar17;
  ulong uVar18;
  BYTE *pBVar19;
  uint uVar20;
  uint uVar21;
  ulong *puVar22;
  BYTE *pBVar23;
  ulong *puVar24;
  ulong *puVar25;
  BYTE *pBVar26;
  long lVar27;
  ulong uVar28;
  ulong *puVar29;
  uint uVar30;
  U32 UVar31;
  U32 UVar32;
  uint uVar33;
  int iVar34;
  U32 UVar35;
  U32 UVar36;
  ZSTD_compressionParameters *cParams;
  ulong local_140;
  U32 local_134;
  ulong *local_f0;
  BYTE *local_b0;
  
  iEnd = (ulong *)((long)src + srcSize);
  puVar4 = (ulong *)((long)src + (srcSize - 8));
  pBVar9 = (ms->window).base;
  uVar6 = (ms->window).dictLimit;
  iStart = pBVar9 + uVar6;
  UVar36 = *rep;
  local_134 = rep[1];
  puVar29 = (ulong *)((ulong)(iStart == (BYTE *)src) + (long)src);
  local_f0 = (ulong *)src;
  if (puVar29 < puVar4) {
    pBVar10 = (ms->window).dictBase;
    uVar7 = (ms->window).lowLimit;
    cParams_00 = &ms->cParams;
    puVar1 = (ulong *)((long)iEnd - 7);
    puVar2 = (ulong *)((long)iEnd - 3);
    puVar3 = (ulong *)((long)iEnd - 1);
    ilimit_w = iEnd + -4;
    do {
      puVar24 = (ulong *)((long)puVar29 + 1);
      iVar34 = (int)puVar29;
      uVar20 = ((iVar34 - (int)pBVar9) - UVar36) + 1;
      pBVar23 = pBVar9;
      if (uVar20 < uVar6) {
        pBVar23 = pBVar10;
      }
      bVar14 = true;
      if ((uVar7 < uVar20 && 2 < (uVar6 - 1) - uVar20) &&
         (*(int *)puVar24 == *(int *)(pBVar23 + uVar20))) {
        puVar22 = iEnd;
        if (uVar20 < uVar6) {
          puVar22 = (ulong *)(pBVar10 + uVar6);
        }
        sVar16 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar29 + 5),(BYTE *)((long)(pBVar23 + uVar20) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar22,iStart);
        local_b0 = (BYTE *)(sVar16 + 4);
        bVar14 = false;
      }
      else {
        local_b0 = (BYTE *)0x0;
      }
      UVar31 = 1;
      UVar35 = UVar36;
      if (bVar14) {
        uVar20 = (ms->cParams).minMatch;
        if (uVar20 - 6 < 2) {
          uVar33 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
          pBVar23 = (ms->window).base;
          uVar30 = iVar34 - (int)pBVar23;
          uVar20 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          UVar31 = (ms->window).lowLimit;
          UVar32 = uVar30 - uVar20;
          if (uVar30 - UVar31 <= uVar20) {
            UVar32 = UVar31;
          }
          pUVar11 = ms->chainTable;
          pBVar19 = (ms->window).dictBase;
          uVar20 = (ms->window).dictLimit;
          if (ms->loadedDictEnd != 0) {
            UVar32 = UVar31;
          }
          uVar21 = uVar30 - uVar33;
          if (uVar30 < uVar33) {
            uVar21 = 0;
          }
          uVar8 = (ms->cParams).searchLog;
          uVar15 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar29,6);
          if (uVar15 <= UVar32) goto LAB_0012dc7f;
          iVar34 = 1 << ((byte)uVar8 & 0x1f);
          local_140 = 999999999;
          pBVar26 = (BYTE *)0x3;
          do {
            if (uVar15 < uVar20) {
              if (pBVar19 + uVar20 < pBVar19 + (ulong)uVar15 + 4) {
LAB_0012e1a4:
                __assert_fail("match+4 <= dictEnd",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x40dd,
                              "size_t ZSTD_HcFindBestMatch_generic(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                             );
              }
              if (*(int *)(pBVar19 + uVar15) == (int)*puVar29) {
                sVar16 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar29 + 4),pBVar19 + (ulong)uVar15 + 4,
                                    (BYTE *)iEnd,pBVar19 + uVar20,pBVar23 + uVar20);
                pBVar17 = (BYTE *)(sVar16 + 4);
              }
              else {
LAB_0012d67a:
                pBVar17 = (BYTE *)0x0;
              }
            }
            else {
              puVar22 = (ulong *)(pBVar23 + uVar15);
              if (pBVar26[(long)puVar22] != *(BYTE *)((long)puVar29 + (long)pBVar26))
              goto LAB_0012d67a;
              puVar25 = puVar29;
              if (puVar29 < puVar1) {
                uVar18 = *puVar29 ^ *puVar22;
                uVar28 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                pBVar17 = (BYTE *)(uVar28 >> 3 & 0x1fffffff);
                if (*puVar22 == *puVar29) {
                  do {
                    puVar25 = puVar25 + 1;
                    puVar22 = puVar22 + 1;
                    if (puVar1 <= puVar25) goto LAB_0012d681;
                    uVar18 = *puVar25 ^ *puVar22;
                    uVar28 = 0;
                    if (uVar18 != 0) {
                      for (; (uVar18 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                      }
                    }
                    pBVar17 = (BYTE *)((long)puVar25 + ((uVar28 >> 3 & 0x1fffffff) - (long)puVar29))
                    ;
                  } while (*puVar22 == *puVar25);
                }
              }
              else {
LAB_0012d681:
                if ((puVar25 < puVar2) && ((int)*puVar22 == (int)*puVar25)) {
                  puVar25 = (ulong *)((long)puVar25 + 4);
                  puVar22 = (ulong *)((long)puVar22 + 4);
                }
                if ((puVar25 < puVar3) && ((short)*puVar22 == (short)*puVar25)) {
                  puVar25 = (ulong *)((long)puVar25 + 2);
                  puVar22 = (ulong *)((long)puVar22 + 2);
                }
                if (puVar25 < iEnd) {
                  puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar22 == (BYTE)*puVar25));
                }
                pBVar17 = (BYTE *)((long)puVar25 - (long)puVar29);
              }
            }
            if ((pBVar26 < pBVar17) &&
               (local_140 = (ulong)((uVar30 + 2) - uVar15), pBVar26 = pBVar17,
               (ulong *)(pBVar17 + (long)puVar29) == iEnd)) {
              bVar14 = false;
            }
            else {
              pBVar17 = pBVar26;
              if (uVar21 < uVar15) {
                uVar15 = pUVar11[uVar15 & uVar33 - 1];
                bVar14 = true;
              }
              else {
                bVar14 = false;
              }
            }
          } while (((bVar14) && (UVar32 < uVar15)) &&
                  (iVar34 = iVar34 + -1, pBVar26 = pBVar17, iVar34 != 0));
        }
        else if (uVar20 == 5) {
          uVar33 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
          pBVar23 = (ms->window).base;
          uVar30 = iVar34 - (int)pBVar23;
          uVar20 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          UVar31 = (ms->window).lowLimit;
          UVar32 = uVar30 - uVar20;
          if (uVar30 - UVar31 <= uVar20) {
            UVar32 = UVar31;
          }
          pUVar11 = ms->chainTable;
          pBVar19 = (ms->window).dictBase;
          uVar20 = (ms->window).dictLimit;
          if (ms->loadedDictEnd != 0) {
            UVar32 = UVar31;
          }
          uVar21 = uVar30 - uVar33;
          if (uVar30 < uVar33) {
            uVar21 = 0;
          }
          uVar8 = (ms->cParams).searchLog;
          uVar15 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar29,5);
          if (UVar32 < uVar15) {
            iVar34 = 1 << ((byte)uVar8 & 0x1f);
            local_140 = 999999999;
            pBVar26 = (BYTE *)0x3;
            do {
              if (uVar15 < uVar20) {
                if (pBVar19 + uVar20 < pBVar19 + (ulong)uVar15 + 4) goto LAB_0012e1a4;
                if (*(int *)(pBVar19 + uVar15) == (int)*puVar29) {
                  sVar16 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar29 + 4),pBVar19 + (ulong)uVar15 + 4,
                                      (BYTE *)iEnd,pBVar19 + uVar20,pBVar23 + uVar20);
                  pBVar17 = (BYTE *)(sVar16 + 4);
                }
                else {
LAB_0012d938:
                  pBVar17 = (BYTE *)0x0;
                }
              }
              else {
                puVar22 = (ulong *)(pBVar23 + uVar15);
                if (pBVar26[(long)puVar22] != *(BYTE *)((long)puVar29 + (long)pBVar26))
                goto LAB_0012d938;
                puVar25 = puVar29;
                if (puVar29 < puVar1) {
                  uVar18 = *puVar29 ^ *puVar22;
                  uVar28 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                    }
                  }
                  pBVar17 = (BYTE *)(uVar28 >> 3 & 0x1fffffff);
                  if (*puVar22 == *puVar29) {
                    do {
                      puVar25 = puVar25 + 1;
                      puVar22 = puVar22 + 1;
                      if (puVar1 <= puVar25) goto LAB_0012d93f;
                      uVar18 = *puVar25 ^ *puVar22;
                      uVar28 = 0;
                      if (uVar18 != 0) {
                        for (; (uVar18 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                        }
                      }
                      pBVar17 = (BYTE *)((long)puVar25 +
                                        ((uVar28 >> 3 & 0x1fffffff) - (long)puVar29));
                    } while (*puVar22 == *puVar25);
                  }
                }
                else {
LAB_0012d93f:
                  if ((puVar25 < puVar2) && ((int)*puVar22 == (int)*puVar25)) {
                    puVar25 = (ulong *)((long)puVar25 + 4);
                    puVar22 = (ulong *)((long)puVar22 + 4);
                  }
                  if ((puVar25 < puVar3) && ((short)*puVar22 == (short)*puVar25)) {
                    puVar25 = (ulong *)((long)puVar25 + 2);
                    puVar22 = (ulong *)((long)puVar22 + 2);
                  }
                  if (puVar25 < iEnd) {
                    puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar22 == (BYTE)*puVar25));
                  }
                  pBVar17 = (BYTE *)((long)puVar25 - (long)puVar29);
                }
              }
              if ((pBVar26 < pBVar17) &&
                 (local_140 = (ulong)((uVar30 + 2) - uVar15), pBVar26 = pBVar17,
                 (ulong *)(pBVar17 + (long)puVar29) == iEnd)) {
                bVar14 = false;
              }
              else {
                pBVar17 = pBVar26;
                if (uVar21 < uVar15) {
                  uVar15 = pUVar11[uVar15 & uVar33 - 1];
                  bVar14 = true;
                }
                else {
                  bVar14 = false;
                }
              }
            } while (((bVar14) && (UVar32 < uVar15)) &&
                    (iVar34 = iVar34 + -1, pBVar26 = pBVar17, iVar34 != 0));
          }
          else {
LAB_0012dc7f:
            pBVar17 = (BYTE *)0x3;
            local_140 = 999999999;
          }
        }
        else {
          uVar33 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
          pBVar23 = (ms->window).base;
          uVar30 = iVar34 - (int)pBVar23;
          uVar20 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          UVar31 = (ms->window).lowLimit;
          UVar32 = uVar30 - uVar20;
          if (uVar30 - UVar31 <= uVar20) {
            UVar32 = UVar31;
          }
          pUVar11 = ms->chainTable;
          pBVar19 = (ms->window).dictBase;
          uVar20 = (ms->window).dictLimit;
          if (ms->loadedDictEnd != 0) {
            UVar32 = UVar31;
          }
          uVar21 = uVar30 - uVar33;
          if (uVar30 < uVar33) {
            uVar21 = 0;
          }
          uVar8 = (ms->cParams).searchLog;
          uVar15 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar29,4);
          if (uVar15 <= UVar32) goto LAB_0012dc7f;
          iVar34 = 1 << ((byte)uVar8 & 0x1f);
          local_140 = 999999999;
          pBVar26 = (BYTE *)0x3;
          do {
            if (uVar15 < uVar20) {
              if (pBVar19 + uVar20 < pBVar19 + (ulong)uVar15 + 4) goto LAB_0012e1a4;
              if (*(int *)(pBVar19 + uVar15) == (int)*puVar29) {
                sVar16 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar29 + 4),pBVar19 + (ulong)uVar15 + 4,
                                    (BYTE *)iEnd,pBVar19 + uVar20,pBVar23 + uVar20);
                pBVar17 = (BYTE *)(sVar16 + 4);
              }
              else {
LAB_0012dbd6:
                pBVar17 = (BYTE *)0x0;
              }
            }
            else {
              puVar22 = (ulong *)(pBVar23 + uVar15);
              if (pBVar26[(long)puVar22] != *(BYTE *)((long)puVar29 + (long)pBVar26))
              goto LAB_0012dbd6;
              puVar25 = puVar29;
              if (puVar29 < puVar1) {
                uVar18 = *puVar29 ^ *puVar22;
                uVar28 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                pBVar17 = (BYTE *)(uVar28 >> 3 & 0x1fffffff);
                if (*puVar22 == *puVar29) {
                  do {
                    puVar25 = puVar25 + 1;
                    puVar22 = puVar22 + 1;
                    if (puVar1 <= puVar25) goto LAB_0012dbdd;
                    uVar18 = *puVar25 ^ *puVar22;
                    uVar28 = 0;
                    if (uVar18 != 0) {
                      for (; (uVar18 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                      }
                    }
                    pBVar17 = (BYTE *)((long)puVar25 + ((uVar28 >> 3 & 0x1fffffff) - (long)puVar29))
                    ;
                  } while (*puVar22 == *puVar25);
                }
              }
              else {
LAB_0012dbdd:
                if ((puVar25 < puVar2) && ((int)*puVar22 == (int)*puVar25)) {
                  puVar25 = (ulong *)((long)puVar25 + 4);
                  puVar22 = (ulong *)((long)puVar22 + 4);
                }
                if ((puVar25 < puVar3) && ((short)*puVar22 == (short)*puVar25)) {
                  puVar25 = (ulong *)((long)puVar25 + 2);
                  puVar22 = (ulong *)((long)puVar22 + 2);
                }
                if (puVar25 < iEnd) {
                  puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar22 == (BYTE)*puVar25));
                }
                pBVar17 = (BYTE *)((long)puVar25 - (long)puVar29);
              }
            }
            if ((pBVar26 < pBVar17) &&
               (local_140 = (ulong)((uVar30 + 2) - uVar15), pBVar26 = pBVar17,
               (ulong *)(pBVar17 + (long)puVar29) == iEnd)) {
              bVar14 = false;
            }
            else {
              pBVar17 = pBVar26;
              if (uVar21 < uVar15) {
                uVar15 = pUVar11[uVar15 & uVar33 - 1];
                bVar14 = true;
              }
              else {
                bVar14 = false;
              }
            }
          } while (((bVar14) && (UVar32 < uVar15)) &&
                  (iVar34 = iVar34 + -1, pBVar26 = pBVar17, iVar34 != 0));
        }
        puVar22 = puVar29;
        if (pBVar17 <= local_b0) {
          local_140 = 0;
          pBVar17 = local_b0;
          puVar22 = puVar24;
        }
        puVar24 = puVar22;
        if ((BYTE *)0x3 < pBVar17) {
          if (local_140 == 0) {
            UVar31 = 1;
            local_b0 = pBVar17;
          }
          else {
            pBVar26 = (BYTE *)((long)puVar24 + (2 - (long)(pBVar9 + local_140)));
            pBVar19 = iStart;
            pBVar23 = pBVar9;
            if ((uint)pBVar26 < uVar6) {
              pBVar19 = pBVar10 + uVar7;
              pBVar23 = pBVar10;
            }
            if ((local_f0 < puVar24) &&
               (uVar28 = (ulong)pBVar26 & 0xffffffff, pBVar19 < pBVar23 + uVar28)) {
              pBVar23 = pBVar23 + uVar28;
              do {
                puVar29 = (ulong *)((long)puVar24 + -1);
                pBVar23 = pBVar23 + -1;
                if ((*(BYTE *)puVar29 != *pBVar23) ||
                   (pBVar17 = pBVar17 + 1, puVar24 = puVar29, puVar29 <= local_f0)) break;
              } while (pBVar19 < pBVar23);
            }
            UVar31 = (int)local_140 + 1;
            local_b0 = pBVar17;
            UVar35 = (int)local_140 - 2;
            local_134 = UVar36;
          }
          goto LAB_0012ddcf;
        }
        puVar29 = (ulong *)((long)puVar29 + ((long)puVar29 - (long)local_f0 >> 8) + 1);
      }
      else {
LAB_0012ddcf:
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0012e166:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_0012e128:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar28 = (long)puVar24 - (long)local_f0;
        puVar29 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar29 + uVar28)) {
LAB_0012e185:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iEnd < puVar24) {
LAB_0012e147:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (ilimit_w < puVar24) {
          ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)local_f0,(BYTE *)puVar24,(BYTE *)ilimit_w);
        }
        else {
          uVar18 = local_f0[1];
          *puVar29 = *local_f0;
          puVar29[1] = uVar18;
          if (0x10 < uVar28) {
            pBVar23 = seqStore->lit;
            puVar29 = (ulong *)(pBVar23 + 0x10);
            puVar22 = local_f0 + 2;
            if (0xffffffffffffffe8 < (ulong)((long)puVar29 + (-8 - (long)puVar22))) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if (0xffffffffffffffe0 < (ulong)((long)puVar29 + (-0x10 - (long)puVar22))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar18 = local_f0[3];
            *puVar29 = *puVar22;
            *(ulong *)(pBVar23 + 0x18) = uVar18;
            if (0x20 < (long)uVar28) {
              lVar27 = 0;
              do {
                puVar5 = (undefined8 *)((long)local_f0 + lVar27 + 0x20);
                uVar13 = puVar5[1];
                pBVar19 = pBVar23 + lVar27 + 0x20;
                *(undefined8 *)pBVar19 = *puVar5;
                *(undefined8 *)(pBVar19 + 8) = uVar13;
                puVar5 = (undefined8 *)((long)local_f0 + lVar27 + 0x30);
                uVar13 = puVar5[1];
                *(undefined8 *)(pBVar19 + 0x10) = *puVar5;
                *(undefined8 *)(pBVar19 + 0x18) = uVar13;
                lVar27 = lVar27 + 0x20;
              } while (pBVar19 + 0x20 < pBVar23 + uVar28);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar28;
        if (0xffff < uVar28) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar12 = seqStore->sequences;
        psVar12->litLength = (U16)uVar28;
        psVar12->offset = UVar31;
        if ((BYTE *)0xffff < local_b0 + -3) {
          if (seqStore->longLengthID != 0) {
LAB_0012e1c3:
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar12->matchLength = (U16)(local_b0 + -3);
        seqStore->sequences = psVar12 + 1;
        puVar29 = (ulong *)((long)puVar24 + (long)local_b0);
        local_f0 = puVar29;
        do {
          UVar36 = UVar35;
          if (puVar4 < puVar29) break;
          uVar20 = (uint)((long)puVar29 - (long)(pBVar9 + local_134));
          pBVar23 = pBVar9;
          if (uVar20 < uVar6) {
            pBVar23 = pBVar10;
          }
          if ((uVar7 < uVar20 && 2 < (uVar6 - 1) - uVar20) &&
             ((int)*puVar29 ==
              *(int *)(pBVar23 + ((long)puVar29 - (long)(pBVar9 + local_134) & 0xffffffff)))) {
            puVar24 = iEnd;
            if (uVar20 < uVar6) {
              puVar24 = (ulong *)(pBVar10 + uVar6);
            }
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar29 + 4),
                                (BYTE *)((long)(pBVar23 +
                                               ((long)puVar29 - (long)(pBVar9 + local_134) &
                                               0xffffffff)) + 4),(BYTE *)iEnd,(BYTE *)puVar24,iStart
                               );
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_0012e166;
            if (0x20000 < seqStore->maxNbLit) goto LAB_0012e128;
            puVar24 = (ulong *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < puVar24) goto LAB_0012e185;
            if (iEnd < local_f0) goto LAB_0012e147;
            if (ilimit_w < local_f0) {
              ZSTD_safecopyLiterals
                        ((BYTE *)puVar24,(BYTE *)local_f0,(BYTE *)local_f0,(BYTE *)ilimit_w);
            }
            else {
              uVar28 = local_f0[1];
              *puVar24 = *local_f0;
              puVar24[1] = uVar28;
            }
            psVar12 = seqStore->sequences;
            psVar12->litLength = 0;
            psVar12->offset = 1;
            if (0xffff < sVar16 + 1) {
              if (seqStore->longLengthID != 0) goto LAB_0012e1c3;
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar12->matchLength = (U16)(sVar16 + 1);
            seqStore->sequences = psVar12 + 1;
            puVar29 = (ulong *)((long)puVar29 + sVar16 + 4);
            bVar14 = true;
            uVar20 = local_134;
            local_134 = UVar35;
            local_f0 = puVar29;
          }
          else {
            bVar14 = false;
            uVar20 = UVar35;
          }
          UVar35 = uVar20;
          UVar36 = UVar35;
        } while (bVar14);
      }
    } while (puVar29 < puVar4);
  }
  *rep = UVar36;
  rep[1] = local_134;
  return (long)iEnd - (long)local_f0;
}

Assistant:

size_t ZSTD_compressBlock_greedy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0);
}